

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O3

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
     build_model(V *values,int num_keys,LinearModel<int> *model,bool use_sampling)

{
  int iVar1;
  undefined7 in_register_00000009;
  ulong uVar2;
  longdouble lVar3;
  longdouble lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 in_XMM3_Qb;
  LinearModelBuilder<int> builder;
  LinearModelBuilder<int> local_78;
  
  if ((int)CONCAT71(in_register_00000009,use_sampling) == 0) {
    local_78.xy_sum_ = (longdouble)0;
    if (num_keys < 1) {
      local_78.y_min_ = 1.79769313486232e+308;
      local_78.y_max_ = -1.79769313486232e+308;
      local_78.x_min_ = 0x7fffffff;
      local_78.x_max_ = -0x80000000;
      num_keys = 0;
      local_78.xx_sum_ = local_78.xy_sum_;
      local_78.y_sum_ = local_78.xy_sum_;
      local_78.x_sum_ = local_78.xy_sum_;
    }
    else {
      auVar5 = ZEXT816(0xffefffffffffffff);
      auVar6 = ZEXT816(0x7fefffffffffffff);
      local_78.x_max_ = -0x80000000;
      local_78.x_min_ = 0x7fffffff;
      local_78.xy_sum_ = (longdouble)0;
      uVar2 = 0;
      local_78.xx_sum_ = local_78.xy_sum_;
      local_78.y_sum_ = local_78.xy_sum_;
      local_78.x_sum_ = local_78.xy_sum_;
      do {
        iVar1 = values[uVar2].first;
        auVar7._0_8_ = (double)(int)uVar2;
        auVar7._8_8_ = in_XMM3_Qb;
        auVar6 = vminsd_avx(auVar6,auVar7);
        local_78.y_min_ = auVar6._0_8_;
        auVar5 = vmaxsd_avx(auVar5,auVar7);
        local_78.y_max_ = auVar5._0_8_;
        lVar3 = (longdouble)iVar1;
        local_78.x_sum_ = local_78.x_sum_ + lVar3;
        if (iVar1 <= local_78.x_min_) {
          local_78.x_min_ = iVar1;
        }
        lVar4 = (longdouble)(int)uVar2;
        if (iVar1 < local_78.x_max_) {
          iVar1 = local_78.x_max_;
        }
        local_78.x_max_ = iVar1;
        uVar2 = uVar2 + 1;
        local_78.y_sum_ = local_78.y_sum_ + lVar4;
        local_78.xx_sum_ = lVar3 * lVar3 + local_78.xx_sum_;
        local_78.xy_sum_ = lVar4 * lVar3 + local_78.xy_sum_;
      } while ((uint)num_keys != uVar2);
    }
    local_78.model_ = model;
    local_78.count_ = num_keys;
    LinearModelBuilder<int>::build(&local_78);
    return;
  }
  build_model_sampling(values,num_keys,model,false);
  return;
}

Assistant:

static void build_model(const V* values, int num_keys, LinearModel<T>* model,
                          bool use_sampling = false) {
    if (use_sampling) {
      build_model_sampling(values, num_keys, model);
      return;
    }

    LinearModelBuilder<T> builder(model);
    for (int i = 0; i < num_keys; i++) {
      builder.add(values[i].first, i);
    }
    builder.build();
  }